

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

string * __thiscall
cmTarget::GetOutputName(string *__return_storage_ptr__,cmTarget *this,string *config,bool implib)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  long *plVar4;
  char *pcVar5;
  size_t sVar6;
  long *plVar7;
  char *pcVar8;
  string *prop;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string configUpper;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  string local_80;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(this->TargetTypeValue) {
  case EXECUTABLE:
    pcVar5 = "RUNTIME";
    goto LAB_002a90ef;
  case STATIC_LIBRARY:
    pcVar5 = "ARCHIVE";
    break;
  case SHARED_LIBRARY:
    pcVar8 = "RUNTIME";
    if (implib) {
      pcVar8 = "ARCHIVE";
    }
    pcVar5 = "LIBRARY";
    if (this->DLLPlatform != false) {
      pcVar5 = pcVar8;
    }
    break;
  case MODULE_LIBRARY:
    pcVar5 = "LIBRARY";
LAB_002a90ef:
    if (implib) {
      pcVar5 = "ARCHIVE";
    }
    break;
  default:
    pcVar5 = "";
  }
  std::__cxx11::string::string((string *)&local_40,pcVar5,(allocator *)&local_80);
  cmsys::SystemTools::UpperCase(&local_80,config);
  if ((local_38 != 0) && (local_80._M_string_length != 0)) {
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char*>((string *)local_60,local_40,local_38 + (long)local_40)
    ;
    std::__cxx11::string::append((char *)local_60);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_60,(ulong)local_80._M_dataplus._M_p);
    plVar7 = plVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar7) {
      lVar3 = plVar4[3];
      local_b8.field_2._M_allocated_capacity._0_7_ = (undefined7)*plVar7;
      local_b8.field_2._M_local_buf[7] = (char)((ulong)*plVar7 >> 0x38);
      local_b8.field_2._8_3_ = (undefined3)lVar3;
      local_b8.field_2._M_local_buf[0xb] = (char)((ulong)lVar3 >> 0x18);
      local_b8.field_2._12_4_ = (undefined4)((ulong)lVar3 >> 0x20);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity._0_7_ = (undefined7)*plVar7;
      local_b8.field_2._M_local_buf[7] = (char)((ulong)*plVar7 >> 0x38);
      local_b8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_b8._M_string_length = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               &local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT17(local_b8.field_2._M_local_buf[7],
                               local_b8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
  }
  if (local_38 != 0) {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_40,local_38 + (long)local_40);
    std::__cxx11::string::append((char *)&local_b8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               &local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT17(local_b8.field_2._M_local_buf[7],
                               local_b8.field_2._M_allocated_capacity._0_7_) + 1);
    }
  }
  if (local_80._M_string_length != 0) {
    std::operator+(&local_b8,"OUTPUT_NAME_",&local_80);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               &local_b8);
    paVar1 = &local_b8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT17(local_b8.field_2._M_local_buf[7],
                               local_b8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
    std::__cxx11::string::append((char *)&local_b8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               &local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT17(local_b8.field_2._M_local_buf[7],
                               local_b8.field_2._M_allocated_capacity._0_7_) + 1);
    }
  }
  local_b8.field_2._M_allocated_capacity._0_7_ = 0x5f54555054554f;
  local_b8.field_2._7_4_ = 0x454d414e;
  local_b8._M_string_length = 0xb;
  local_b8.field_2._M_local_buf[0xb] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
             &local_b8);
  prop = local_98.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT17(local_b8.field_2._M_local_buf[7],
                             local_b8.field_2._M_allocated_capacity._0_7_) + 1);
    prop = local_98.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  }
  do {
    if (prop == local_98.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (this->Name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->Name)._M_string_length);
LAB_002a93a6:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (local_40 != local_30) {
        operator_delete(local_40,local_30[0] + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_98);
      return __return_storage_ptr__;
    }
    pcVar5 = GetProperty(this,prop,this->Makefile);
    if (pcVar5 != (char *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      sVar6 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,pcVar5,pcVar5 + sVar6);
      goto LAB_002a93a6;
    }
    prop = prop + 1;
  } while( true );
}

Assistant:

std::string cmTarget::GetOutputName(const std::string& config,
                                    bool implib) const
{
  std::vector<std::string> props;
  std::string type = this->GetOutputTargetType(implib);
  std::string configUpper = cmSystemTools::UpperCase(config);
  if(!type.empty() && !configUpper.empty())
    {
    // <ARCHIVE|LIBRARY|RUNTIME>_OUTPUT_NAME_<CONFIG>
    props.push_back(type + "_OUTPUT_NAME_" + configUpper);
    }
  if(!type.empty())
    {
    // <ARCHIVE|LIBRARY|RUNTIME>_OUTPUT_NAME
    props.push_back(type + "_OUTPUT_NAME");
    }
  if(!configUpper.empty())
    {
    // OUTPUT_NAME_<CONFIG>
    props.push_back("OUTPUT_NAME_" + configUpper);
    // <CONFIG>_OUTPUT_NAME
    props.push_back(configUpper + "_OUTPUT_NAME");
    }
  // OUTPUT_NAME
  props.push_back("OUTPUT_NAME");

  for(std::vector<std::string>::const_iterator i = props.begin();
      i != props.end(); ++i)
    {
    if(const char* outName = this->GetProperty(*i))
      {
      return outName;
      }
    }
  return this->GetName();
}